

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * CompileVmZeroInitialize(ExpressionContext *ctx,VmModule *module,ExprZeroInitialize *node)

{
  TypeBase *pTVar1;
  Allocator *pAVar2;
  SynBase *source;
  int iVar3;
  VmValue *pVVar4;
  ulong uVar5;
  VmConstant *pVVar6;
  undefined4 extraout_var;
  VmConstant *el1;
  VmConstant *el2;
  VmValueType VVar7;
  VmType type;
  SynBase *local_48;
  
  pTVar1 = node->address->type;
  if ((pTVar1 == (TypeBase *)0x0) || (pTVar1->typeID != 0x12)) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xd7d,
                  "VmValue *CompileVmZeroInitialize(ExpressionContext &, VmModule *, ExprZeroInitialize *)"
                 );
  }
  pVVar4 = CompileVm(ctx,module,node->address);
  type = GetVmType(ctx,(TypeBase *)pTVar1[1]._vptr_TypeBase);
  VVar7 = type.type;
  uVar5 = type._0_8_ >> 0x20;
  if ((VVar7 == VM_TYPE_INT && uVar5 == 4) ||
     ((VVar7 & ~VM_TYPE_INT) == VM_TYPE_DOUBLE && type.size == 8)) {
    pVVar6 = CreateConstantZero(ctx->allocator,(node->super_ExprBase).source,type);
  }
  else {
    switch(VVar7) {
    case VM_TYPE_POINTER:
      pVVar6 = CreateConstantPointer
                         (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                          (TypeBase *)pTVar1[1]._vptr_TypeBase,false);
      goto LAB_00198640;
    case VM_TYPE_FUNCTION_REF:
    case VM_TYPE_ARRAY_REF:
      local_48 = (node->super_ExprBase).source;
      pVVar6 = CreateConstantPointer
                         (module->allocator,local_48,0,(VariableData *)0x0,ctx->typeNullPtr,false);
      el1 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
      break;
    case VM_TYPE_AUTO_REF:
      local_48 = (node->super_ExprBase).source;
      pVVar6 = CreateConstantInt(module->allocator,local_48,0);
      el1 = CreateConstantPointer
                      (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                       ctx->typeNullPtr,false);
      break;
    case VM_TYPE_AUTO_ARRAY:
      local_48 = (node->super_ExprBase).source;
      pVVar6 = CreateConstantInt(module->allocator,local_48,0);
      el1 = CreateConstantPointer
                      (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                       ctx->typeNullPtr,false);
      el2 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
      goto LAB_00198829;
    case VM_TYPE_STRUCT:
      if (uVar5 != 0) {
        source = (node->super_ExprBase).source;
        pVVar6 = CreateConstantZero(ctx->allocator,source,(VmType)ZEXT816(0x400000001));
        anon_unknown.dwarf_107107::CreateSetRange
                  (module,source,pVVar4,type.size >> 2,&pVVar6->super_VmValue,4);
      }
      goto LAB_00198663;
    default:
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0xdae,
                    "VmValue *CompileVmZeroInitialize(ExpressionContext &, VmModule *, ExprZeroInitialize *)"
                   );
    }
    el2 = (VmConstant *)0x0;
LAB_00198829:
    pVVar6 = (VmConstant *)
             anon_unknown.dwarf_107107::CreateConstruct
                       (module,local_48,type,&pVVar6->super_VmValue,&el1->super_VmValue,
                        &el2->super_VmValue,&pVVar6->super_VmValue);
  }
LAB_00198640:
  anon_unknown.dwarf_107107::CreateStore
            (ctx,module,(node->super_ExprBase).source,(TypeBase *)pTVar1[1]._vptr_TypeBase,pVVar4,
             &pVVar6->super_VmValue,0);
LAB_00198663:
  iVar3 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98);
  pVVar4 = (VmValue *)CONCAT44(extraout_var,iVar3);
  pAVar2 = module->allocator;
  pVVar4->typeID = 0;
  pVVar4->source = (SynBase *)0x0;
  (pVVar4->comment).begin = (char *)0x0;
  (pVVar4->type).type = VM_TYPE_VOID;
  (pVVar4->type).size = 0;
  (pVVar4->type).structType = (TypeBase *)0x0;
  (pVVar4->comment).end = (char *)0x0;
  (pVVar4->users).allocator = pAVar2;
  (pVVar4->users).data = (pVVar4->users).little;
  (pVVar4->users).count = 0;
  (pVVar4->users).max = 8;
  pVVar4->hasKnownNonSimpleUse = false;
  pVVar4->hasSideEffects = false;
  pVVar4->hasMemoryAccess = false;
  pVVar4->canBeRemoved = true;
  pVVar4->hasKnownSimpleUse = false;
  pVVar4->_vptr_VmValue = (_func_int **)&PTR__VmValue_00224c70;
  pVVar4 = anon_unknown.dwarf_107107::CheckType(ctx,(ExprBase *)(node->super_ExprBase).type,pVVar4);
  return pVVar4;
}

Assistant:

VmValue* CompileVmZeroInitialize(ExpressionContext &ctx, VmModule *module, ExprZeroInitialize *node)
{
	TypeRef *refType = getType<TypeRef>(node->address->type);

	assert(refType);

	VmValue *address = CompileVm(ctx, module, node->address);

	VmType vmType = GetVmType(ctx, refType->subType);

	if(vmType == VmType::Int || vmType == VmType::Double || vmType == VmType::Long)
	{
		VmValue *initializer = CreateConstantZero(ctx.allocator, node->source, vmType);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_POINTER)
	{
		VmValue *initializer = CreateConstantPointer(module->allocator, node->source, 0, NULL, refType->subType, false);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_FUNCTION_REF)
	{
		VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_ARRAY_REF)
	{
		VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_AUTO_REF)
	{
		VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), NULL, NULL);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_AUTO_ARRAY)
	{
		VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_STRUCT)
	{
		if(vmType.size != 0)
			CreateSetRange(module, node->source, address, vmType.size / 4, CreateConstantZero(ctx.allocator, node->source, VmType::Int), 4);
	}
	else// if(vmType != VmType::Void)
	{
		assert(!"unknown type");
	}

	return CheckType(ctx, node, CreateVoid(module));
}